

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  char_t *pcVar1;
  byte bVar2;
  byte *s_00;
  gap g;
  gap local_28;
  
  local_28.end = (char_t *)0x0;
  local_28.size = 0;
  do {
    do {
      s_00 = (byte *)s;
      bVar2 = *s_00;
      if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) goto LAB_001a781a;
      bVar2 = s_00[1];
      if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
        s_00 = s_00 + 1;
        goto LAB_001a781a;
      }
      bVar2 = s_00[2];
      if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
        s_00 = s_00 + 2;
        goto LAB_001a781a;
      }
      bVar2 = s_00[3];
      s = (char_t *)(s_00 + 4);
    } while (((anonymous_namespace)::chartype_table[bVar2] & 1) == 0);
    s_00 = s_00 + 3;
LAB_001a781a:
    if (bVar2 == 0x26) {
      s = strconv_escape((char_t *)s_00,&local_28);
    }
    else {
      if (bVar2 == 0) {
        pcVar1 = gap::flush(&local_28,(char_t *)s_00);
        *pcVar1 = '\0';
        return (char_t *)s_00;
      }
      if (bVar2 == 0x3c) {
        pcVar1 = gap::flush(&local_28,(char_t *)s_00);
        *pcVar1 = '\0';
        return (char_t *)(s_00 + 1);
      }
      s = (char_t *)(s_00 + 1);
    }
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}